

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lite_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_0::LiteTest_AllLite47_Test<absl::lts_20250127::Cord>::TestBody
          (LiteTest_AllLite47_Test<absl::lts_20250127::Cord> *this)

{
  bool bVar1;
  char *pcVar2;
  char *in_R9;
  AssertHelper local_188;
  Message local_180;
  uint32_t local_178 [2];
  undefined1 local_170 [8];
  AssertionResult gtest_ar_1;
  Message local_158;
  int local_150 [2];
  undefined1 local_148 [8];
  AssertionResult gtest_ar;
  AssertHelper local_118;
  Message local_110;
  string_view local_108;
  bool local_f1;
  undefined1 local_f0 [8];
  AssertionResult gtest_ar__1;
  PackedFixed32 packed;
  string local_b0;
  AssertHelper local_90;
  Message local_88;
  bool local_79;
  undefined1 local_78 [8];
  AssertionResult gtest_ar_;
  string serialized;
  undefined1 local_38 [8];
  NonPackedFixed32 non_packed;
  LiteTest_AllLite47_Test<absl::lts_20250127::Cord> *this_local;
  
  non_packed.field_0._16_8_ = this;
  proto2_unittest::NonPackedFixed32::NonPackedFixed32((NonPackedFixed32 *)local_38);
  proto2_unittest::NonPackedFixed32::add_repeated_fixed32((NonPackedFixed32 *)local_38,0x2a);
  std::__cxx11::string::string((string *)&gtest_ar_.message_);
  local_79 = MessageLite::SerializeToString((MessageLite *)local_38,(string *)&gtest_ar_.message_);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_78,&local_79,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_78);
  if (!bVar1) {
    testing::Message::Message(&local_88);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_b0,(internal *)local_78,
               (AssertionResult *)"non_packed.SerializeToString(&serialized)","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_90,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/lite_unittest.cc"
               ,0x45b,pcVar2);
    testing::internal::AssertHelper::operator=(&local_90,&local_88);
    testing::internal::AssertHelper::~AssertHelper(&local_90);
    std::__cxx11::string::~string((string *)&local_b0);
    testing::Message::~Message(&local_88);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_78);
  if (bVar1) {
    proto2_unittest::PackedFixed32::PackedFixed32((PackedFixed32 *)&gtest_ar__1.message_);
    local_108 = (string_view)
                std::__cxx11::string::operator_cast_to_basic_string_view
                          ((string *)&gtest_ar_.message_);
    local_f1 = MessageLite::ParseFromString((MessageLite *)&gtest_ar__1.message_,local_108);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_f0,&local_f1,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f0);
    if (!bVar1) {
      testing::Message::Message(&local_110);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar.message_,(internal *)local_f0,(AssertionResult *)0x4674ad,
                 "false","true",in_R9);
      pcVar2 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_118,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/lite_unittest.cc"
                 ,0x45e,pcVar2);
      testing::internal::AssertHelper::operator=(&local_118,&local_110);
      testing::internal::AssertHelper::~AssertHelper(&local_118);
      std::__cxx11::string::~string((string *)&gtest_ar.message_);
      testing::Message::~Message(&local_110);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_f0);
    if (bVar1) {
      local_150[1] = 1;
      local_150[0] = proto2_unittest::PackedFixed32::repeated_fixed32_size
                               ((PackedFixed32 *)&gtest_ar__1.message_);
      testing::internal::EqHelper::Compare<int,_int,_nullptr>
                ((EqHelper *)local_148,"1","packed.repeated_fixed32_size()",local_150 + 1,local_150)
      ;
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_148);
      if (!bVar1) {
        testing::Message::Message(&local_158);
        pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_148);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_1.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/lite_unittest.cc"
                   ,0x45f,pcVar2);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_158);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
        testing::Message::~Message(&local_158);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_148);
      if (bVar1) {
        local_178[1] = 0x2a;
        local_178[0] = proto2_unittest::PackedFixed32::repeated_fixed32
                                 ((PackedFixed32 *)&gtest_ar__1.message_,0);
        testing::internal::EqHelper::Compare<int,_unsigned_int,_nullptr>
                  ((EqHelper *)local_170,"42","packed.repeated_fixed32(0)",(int *)(local_178 + 1),
                   local_178);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_170);
        if (!bVar1) {
          testing::Message::Message(&local_180);
          pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_170);
          testing::internal::AssertHelper::AssertHelper
                    (&local_188,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/lite_unittest.cc"
                     ,0x460,pcVar2);
          testing::internal::AssertHelper::operator=(&local_188,&local_180);
          testing::internal::AssertHelper::~AssertHelper(&local_188);
          testing::Message::~Message(&local_180);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_170);
      }
    }
    proto2_unittest::PackedFixed32::~PackedFixed32((PackedFixed32 *)&gtest_ar__1.message_);
  }
  std::__cxx11::string::~string((string *)&gtest_ar_.message_);
  proto2_unittest::NonPackedFixed32::~NonPackedFixed32((NonPackedFixed32 *)local_38);
  return;
}

Assistant:

TYPED_TEST(LiteTest, AllLite47) {
  proto2_unittest::NonPackedFixed32 non_packed;
  non_packed.add_repeated_fixed32(42);
  std::string serialized;
  ASSERT_TRUE(non_packed.SerializeToString(&serialized));

  proto2_unittest::PackedFixed32 packed;
  ASSERT_TRUE(packed.ParseFromString(serialized));
  ASSERT_EQ(1, packed.repeated_fixed32_size());
  EXPECT_EQ(42, packed.repeated_fixed32(0));
}